

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::Uniform::Uniform(Uniform *this,char *name_,VarType *type_)

{
  allocator<char> local_21;
  VarType *local_20;
  VarType *type__local;
  char *name__local;
  Uniform *this_local;
  
  local_20 = type_;
  type__local = (VarType *)name_;
  name__local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,name_,&local_21);
  std::allocator<char>::~allocator(&local_21);
  glu::VarType::VarType(&this->type,local_20);
  return;
}

Assistant:

Uniform (const char* const name_, const glu::VarType& type_) : name(name_), type(type_) {}